

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_compress_symbolic.cpp
# Opt level: O2

void compress_block(astcenc_contexti *ctx,image_block *blk,uint8_t *pcb,
                   compression_working_buffers *tmpbuf)

{
  endpoints_and_weights *ei2;
  float *dec_weight_ideal_value;
  decimation_info *pdVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  astcenc_profile aVar5;
  int iVar6;
  block_size_descriptor *bsd;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  bool bVar13;
  uint8_t uVar14;
  uint quant_limit;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  block_mode *pbVar19;
  partition_info *pi;
  uint16_t *puVar20;
  uint uVar21;
  ulong uVar22;
  int partition_count;
  decimation_info *pdVar23;
  long lVar24;
  uint uVar25;
  uint i_1;
  byte *pbVar26;
  int i;
  ulong uVar27;
  ulong uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar40 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  vfloat4 color0;
  vfloat4 color1;
  vfloat4 rgbs_color_00;
  vfloat4 rgbo_color_00;
  float errorval_mult [2];
  symbolic_compressed_block workscb;
  vfloat4 rgbo_color;
  vfloat4 rgbs_color;
  quant_method color_quant_level [8];
  int block_mode_index [8];
  uint8_t partition_format_specifiers [8] [4];
  endpoints epm;
  quant_method color_quant_level_mod [8];
  undefined1 local_550 [16];
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_508;
  float afStack_444 [7];
  float local_428 [2];
  undefined8 local_420;
  undefined4 uStack_418;
  float afStack_414 [2];
  undefined8 local_40c;
  undefined4 local_404;
  float *local_3f8;
  int8_t *local_3f0;
  undefined1 *local_3e8;
  uint16_t *local_3e0;
  uint8_t *local_3d8;
  long local_3d0;
  block_mode *local_3c8;
  undefined8 local_3c0;
  uint local_3b8 [2];
  undefined8 local_3b0;
  uint local_3a8;
  undefined1 local_3a0 [128];
  undefined1 local_320 [128];
  vfloat4 local_2a0;
  vfloat4 local_290;
  quant_method local_280 [8];
  int local_260 [8];
  byte local_240 [32];
  endpoints local_220;
  quant_method local_110 [8];
  endpoints local_f0;
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 auVar63 [16];
  
  aVar5 = (ctx->config).profile;
  bsd = ctx->bsd;
  bVar12 = image_block::is_luminance(blk);
  bVar13 = image_block::is_luminancealpha(blk);
  local_3d0 = (long)(int)(ctx->config).tune_partition_count_limit;
  local_3b0._0_4_ = (ctx->config).tune_2partition_index_limit;
  local_3b0._4_4_ = (ctx->config).tune_3partition_index_limit;
  local_3a8 = (ctx->config).tune_4partition_index_limit;
  local_3c0._0_4_ = (ctx->config).tune_2partitioning_candidate_limit;
  local_3c0._4_4_ = (ctx->config).tune_3partitioning_candidate_limit;
  local_3b8[0] = (ctx->config).tune_4partitioning_candidate_limit;
  auVar33 = vcmpps_avx(*(undefined1 (*) [16])(blk->data_max).m,
                       *(undefined1 (*) [16])(blk->data_min).m,4);
  if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar33 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar33 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar33[0xf]) {
    local_320[1] = '\0';
    auVar33 = *(undefined1 (*) [16])(blk->origin_texel).m;
    if ((aVar5 & ~ASTCENC_PRF_LDR) == ASTCENC_PRF_HDR_RGB_LDR_A) {
      auVar33 = vcvtps2ph_f16c(auVar33,0);
      auVar34 = vpmovzxwd_avx(auVar33);
      local_320[0] = '\x01';
    }
    else {
      auVar33 = vmaxps_avx(auVar33,ZEXT816(0) << 0x40);
      auVar35._8_4_ = 0x3f800000;
      auVar35._0_8_ = 0x3f8000003f800000;
      auVar35._12_4_ = 0x3f800000;
      auVar33 = vminps_avx(auVar33,auVar35);
      auVar34._0_4_ = (int)(auVar33._0_4_ * 65535.0 + 0.5);
      auVar34._4_4_ = (int)(auVar33._4_4_ * 65535.0 + 0.5);
      auVar34._8_4_ = (int)(auVar33._8_4_ * 65535.0 + 0.5);
      auVar34._12_4_ = (int)(auVar33._12_4_ * 65535.0 + 0.5);
      local_320[0] = '\x02';
    }
    local_320._20_4_ = auVar34._0_4_;
    local_320._24_4_ = auVar34._4_4_;
    local_320._28_4_ = auVar34._8_4_;
    local_320._32_4_ = auVar34._12_4_;
LAB_00255153:
    symbolic_to_physical(bsd,(symbolic_compressed_block *)local_320,pcb);
    return;
  }
  fVar31 = 1.0;
  fVar29 = fVar31;
  if (bVar13) {
    fVar29 = 0.952381;
  }
  if (bVar12) {
    fVar31 = 0.6666667;
  }
  uVar2 = *(undefined8 *)((blk->channel_weight).m + 2);
  fVar45 = (float)uVar2;
  auVar33._0_4_ = fVar45 + (blk->channel_weight).m[0];
  fVar30 = (float)((ulong)uVar2 >> 0x20);
  auVar33._4_4_ = fVar30 + (blk->channel_weight).m[1];
  auVar33._8_4_ = fVar45 + (blk->channel_weight).m[2];
  auVar33._12_4_ = fVar30 + (blk->channel_weight).m[3];
  auVar33 = vhaddps_avx(auVar33,auVar33);
  local_320._16_4_ = 1e+30;
  local_320[0] = '\0';
  afStack_444[1] = 1e+30;
  afStack_444[2] = 1e+30;
  afStack_444[3] = 1e+30;
  afStack_444[4] = 1e+30;
  afStack_414[1] = 0.0;
  local_40c._0_4_ = (ctx->config).tune_2partition_early_out_limit_factor;
  local_40c._4_4_ = (ctx->config).tune_3partition_early_out_limit_factor;
  local_404 = 0;
  fVar45 = 1.0 / (ctx->config).tune_mse_overshoot;
  local_428[0] = fVar45;
  local_428[1] = 1.0;
  local_3d8 = pcb;
  if (0.85 <= (ctx->config).tune_search_mode0_enable) {
    uVar27 = (ulong)(bsd->zdim != '\x01');
  }
  else {
    uVar27 = 1;
  }
  fVar29 = fVar29 * fVar31 * auVar33._0_4_ * (float)bsd->texel_count * (ctx->config).tune_db_limit;
  quant_limit = 0xb;
  auVar40 = ZEXT464(0x7149f2ca);
  while (uVar27 != 2) {
    fVar31 = local_428[uVar27];
    fVar30 = compress_symbolic_block_for_partition_1plane
                       (&ctx->config,bsd,blk,uVar27 == 0,fVar29 * fVar31 * fVar45,1,0,
                        (symbolic_compressed_block *)local_320,tmpbuf,0xb);
    pbVar19 = block_size_descriptor::get_block_mode(bsd,(uint)(ushort)local_320._4_2_);
    quant_limit = (uint)pbVar19->quant_mode;
    auVar33 = vminss_avx(ZEXT416(auVar40._0_4_),ZEXT416((uint)fVar30));
    auVar40 = ZEXT1664(auVar33);
    uVar27 = uVar27 + 1;
    if (fVar30 < fVar29 * fVar31) goto LAB_002550ea;
  }
  afStack_444[1] = (float)auVar40._0_4_;
  if ((ulong)bsd->texel_count == 0) {
    __assert_fail("texels_per_block > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                  ,0x42f,"float prepare_block_statistics(int, const image_block &)");
  }
  uVar2 = *(undefined8 *)((blk->channel_weight).m + 2);
  fVar31 = (float)uVar2;
  auVar36._0_4_ = fVar31 + (blk->channel_weight).m[0];
  fVar30 = (float)((ulong)uVar2 >> 0x20);
  auVar36._4_4_ = fVar30 + (blk->channel_weight).m[1];
  auVar36._8_4_ = fVar31 + (blk->channel_weight).m[2];
  auVar36._12_4_ = fVar30 + (blk->channel_weight).m[3];
  auVar33 = vhaddps_avx(auVar36,auVar36);
  fVar7 = auVar33._0_4_ * 0.25;
  auVar40 = ZEXT1664(ZEXT816(0) << 0x40);
  fVar59 = 0.0;
  fVar30 = 0.0;
  fVar32 = 0.0;
  fVar31 = 0.0;
  fVar72 = 0.0;
  fVar73 = 0.0;
  fVar74 = 0.0;
  fVar75 = 0.0;
  fVar69 = 0.0;
  fVar70 = 0.0;
  fVar71 = 0.0;
  afStack_444[0] = 0.0;
  local_530 = 0.0;
  fStack_52c = 0.0;
  fStack_528 = 0.0;
  fStack_524 = 0.0;
  auVar33 = ZEXT816(0) << 0x20;
  for (uVar27 = 0; bsd->texel_count != uVar27; uVar27 = uVar27 + 1) {
    if (fVar7 < 0.0) {
      __assert_fail("weight >= 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                    ,0x433,"float prepare_block_statistics(int, const image_block &)");
    }
    fVar52 = blk->data_g[uVar27];
    fVar8 = blk->data_r[uVar27] * fVar7;
    fVar31 = fVar8 + fVar31;
    fVar30 = blk->data_r[uVar27] * fVar8 + fVar30;
    fVar55 = blk->data_b[uVar27];
    auVar34 = vinsertps_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar55),0x10);
    auVar67._4_4_ = fVar8;
    auVar67._0_4_ = fVar8;
    auVar67._8_4_ = fVar8;
    auVar67._12_4_ = fVar8;
    fVar69 = fVar69 + auVar34._0_4_ * fVar8;
    fVar70 = fVar70 + auVar34._4_4_ * fVar8;
    fVar71 = fVar71 + auVar34._8_4_ * fVar8;
    afStack_444[0] = afStack_444[0] + auVar34._12_4_ * fVar8;
    fVar8 = fVar52 * fVar7;
    fVar32 = fVar32 + fVar8;
    fVar59 = fVar52 * fVar8 + fVar59;
    auVar34 = vinsertps_avx(ZEXT416((uint)fVar55),ZEXT416((uint)blk->data_a[uVar27]),0x10);
    auVar35 = vinsertps_avx(ZEXT416((uint)blk->data_a[uVar27]),ZEXT416((uint)fVar55),0x10);
    auVar66._0_4_ = auVar34._0_4_ * fVar7;
    auVar66._4_4_ = auVar34._4_4_ * fVar7;
    auVar66._8_4_ = auVar34._8_4_ * fVar7;
    auVar66._12_4_ = auVar34._12_4_ * fVar7;
    auVar36 = vinsertps_avx(auVar66,ZEXT416((uint)fVar8),0x10);
    auVar68._8_8_ = auVar67._8_8_;
    auVar68._0_8_ = auVar36._0_8_;
    auVar35 = vshufps_avx(auVar35,auVar35,0x10);
    auVar36 = vshufps_avx(auVar68,auVar68,0xd4);
    local_530 = local_530 + auVar35._0_4_ * auVar36._0_4_;
    fStack_52c = fStack_52c + auVar35._4_4_ * auVar36._4_4_;
    fStack_528 = fStack_528 + auVar35._8_4_ * auVar36._8_4_;
    fStack_524 = fStack_524 + auVar35._12_4_ * auVar36._12_4_;
    fVar72 = fVar72 + auVar66._0_4_;
    fVar73 = fVar73 + auVar66._4_4_;
    fVar74 = fVar74 + auVar66._8_4_;
    fVar75 = fVar75 + auVar66._12_4_;
    auVar37._0_4_ = auVar34._0_4_ * auVar66._0_4_ + auVar33._0_4_;
    auVar37._4_4_ = auVar34._4_4_ * auVar66._4_4_ + auVar33._4_4_;
    auVar37._8_4_ = auVar34._8_4_ * auVar66._8_4_ + auVar33._8_4_;
    auVar37._12_4_ = auVar34._12_4_ * auVar66._12_4_ + auVar33._12_4_;
    auVar40 = ZEXT464((uint)(fVar7 + auVar40._0_4_));
    auVar33 = auVar37;
  }
  auVar34 = vmaxss_avx(auVar40._0_16_,ZEXT416(0x33d6bf95));
  fVar52 = 1.0 / auVar34._0_4_;
  fVar7 = fVar52 * fVar31;
  fVar30 = fVar30 - fVar31 * fVar7;
  fVar59 = fVar59 - fVar32 * fVar32 * fVar52;
  auVar46._0_4_ = fVar72 * fVar72 * fVar52;
  auVar46._4_4_ = fVar73 * fVar73 * fVar52;
  auVar46._8_4_ = fVar74 * fVar74 * fVar52;
  auVar46._12_4_ = fVar75 * fVar75 * fVar52;
  local_550 = vsubps_avx(auVar33,auVar46);
  fVar31 = fVar59 * fVar30;
  local_420._0_4_ = fVar32;
  local_420._4_4_ = 0;
  uStack_418 = 0;
  afStack_414[0] = 0.0;
  if (fVar31 < 0.0) {
    auVar40._0_4_ = sqrtf(fVar31);
    auVar40._4_60_ = extraout_var;
    auVar33 = auVar40._0_16_;
  }
  else {
    auVar33 = vsqrtss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31));
  }
  fVar55 = local_550._0_4_;
  fVar31 = fVar55 * fVar30;
  if (fVar31 < 0.0) {
    auVar65._0_4_ = sqrtf(fVar31);
    auVar65._4_60_ = extraout_var_00;
    auVar34 = auVar65._0_16_;
  }
  else {
    auVar34 = vsqrtss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31));
  }
  auVar35 = vmovshdup_avx(local_550);
  fVar31 = auVar35._0_4_;
  fVar30 = fVar31 * fVar30;
  if (fVar30 < 0.0) {
    auVar64._0_4_ = sqrtf(fVar30);
    auVar64._4_60_ = extraout_var_01;
    auVar35 = auVar64._0_16_;
  }
  else {
    auVar35 = vsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
  }
  fVar30 = fVar55 * fVar59;
  if (fVar30 < 0.0) {
    auVar58._0_4_ = sqrtf(fVar30);
    auVar58._4_60_ = extraout_var_02;
    auVar36 = auVar58._0_16_;
  }
  else {
    auVar36 = vsqrtss_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30));
  }
  fVar59 = fVar31 * fVar59;
  if (fVar59 < 0.0) {
    auVar62._0_4_ = sqrtf(fVar59);
    auVar62._4_60_ = extraout_var_03;
    auVar37 = auVar62._0_16_;
  }
  else {
    auVar37 = vsqrtss_avx(ZEXT416((uint)fVar59),ZEXT416((uint)fVar59));
  }
  auVar3._4_4_ = fVar73;
  auVar3._0_4_ = fVar72;
  auVar3._8_4_ = fVar74;
  auVar3._12_4_ = fVar75;
  auVar66 = vshufps_avx(auVar3,auVar3,0x45);
  fVar31 = fVar31 * fVar55;
  if (fVar31 < 0.0) {
    auVar41._0_4_ = sqrtf(fVar31);
    auVar41._4_60_ = extraout_var_04;
    auVar67 = auVar41._0_16_;
    local_550 = auVar37;
  }
  else {
    auVar67 = vsqrtss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31));
  }
  auVar65 = ZEXT1664(auVar3);
  auVar11._4_4_ = fVar70;
  auVar11._0_4_ = fVar69;
  auVar11._8_4_ = fVar71;
  auVar11._12_4_ = afStack_444[0];
  auVar40 = ZEXT1664(auVar11);
  auVar9._4_4_ = fStack_52c;
  auVar9._0_4_ = local_530;
  auVar9._8_4_ = fStack_528;
  auVar9._12_4_ = fStack_524;
  auVar10._4_4_ = fVar73 * fVar52;
  auVar10._0_4_ = fVar72 * fVar52;
  auVar10._8_4_ = fVar74 * fVar52;
  auVar10._12_4_ = fVar75 * fVar52;
  auVar37 = vinsertps_avx(auVar67,auVar37,0x10);
  auVar36 = vinsertps_avx(auVar37,auVar36,0x20);
  auVar35 = vinsertps_avx(auVar36,auVar35,0x30);
  auVar36 = vinsertps_avx(auVar10,ZEXT416((uint)(fVar32 * fVar52)),0x10);
  auVar53._4_4_ = fVar7;
  auVar53._0_4_ = fVar7;
  auVar53._8_4_ = fVar7;
  auVar53._12_4_ = fVar7;
  auVar47._0_8_ = auVar36._0_8_;
  auVar47._8_8_ = auVar53._8_8_;
  auVar36 = vshufps_avx(auVar47,auVar47,0xd4);
  auVar48._0_4_ = auVar66._0_4_ * auVar36._0_4_;
  auVar48._4_4_ = auVar66._4_4_ * auVar36._4_4_;
  auVar48._8_4_ = auVar66._8_4_ * auVar36._8_4_;
  auVar48._12_4_ = auVar66._12_4_ * auVar36._12_4_;
  auVar36 = vsubps_avx(auVar9,auVar48);
  auVar60._8_4_ = 0x3f800000;
  auVar60._0_8_ = 0x3f8000003f800000;
  auVar60._12_4_ = 0x3f800000;
  auVar35 = vdivps_avx(auVar60,auVar35);
  auVar38._0_4_ = auVar36._0_4_ * auVar35._0_4_;
  auVar38._4_4_ = auVar36._4_4_ * auVar35._4_4_;
  auVar38._8_4_ = auVar36._8_4_ * auVar35._8_4_;
  auVar38._12_4_ = auVar36._12_4_ * auVar35._12_4_;
  auVar35 = vcmpps_avx(auVar38,ZEXT816(0) << 0x20,3);
  uVar15 = vmovmskps_avx(auVar35);
  fVar31 = auVar3._0_4_;
  auVar49._0_4_ = (float)local_420 * fVar7;
  auVar49._4_4_ = fVar31 * fVar7;
  auVar49._8_4_ = fVar31 * fVar7;
  auVar49._12_4_ = fVar31 * fVar7;
  auVar35 = vsubps_avx(auVar11,auVar49);
  auVar33 = vinsertps_avx(auVar33,auVar34,0x10);
  auVar33 = vdivps_avx(auVar60,auVar33);
  auVar54._0_4_ = auVar35._0_4_ * auVar33._0_4_;
  auVar54._4_4_ = auVar35._4_4_ * auVar33._4_4_;
  auVar54._8_4_ = auVar35._8_4_ * auVar33._8_4_;
  auVar54._12_4_ = auVar35._12_4_ * auVar33._12_4_;
  auVar50._8_4_ = 0x7fffffff;
  auVar50._0_8_ = 0x7fffffff7fffffff;
  auVar50._12_4_ = 0x7fffffff;
  auVar34 = vcmpps_avx(auVar54,ZEXT816(0) << 0x20,3);
  auVar33 = vandps_avx(auVar54,auVar50);
  auVar33 = vblendvps_avx(auVar33,auVar60,auVar34);
  auVar34 = vmovshdup_avx(auVar33);
  auVar34 = vminss_avx(auVar33,auVar34);
  auVar33 = SUB6416(ZEXT464(0x3f800000),0);
  if ((uVar15 & 8) == 0) {
    auVar33 = vshufps_avx(auVar38,auVar38,0xff);
    auVar33 = vandps_avx(auVar33,auVar50);
  }
  auVar34 = vminss_avx(auVar34,auVar33);
  auVar33 = SUB6416(ZEXT464(0x3f800000),0);
  if ((uVar15 & 4) == 0) {
    auVar33 = vshufpd_avx(auVar38,auVar38,1);
    auVar33 = vandpd_avx(auVar33,auVar50);
  }
  auVar34 = vminss_avx(auVar34,auVar33);
  auVar33 = SUB6416(ZEXT464(0x3f800000),0);
  if ((uVar15 & 2) == 0) {
    auVar33 = vmovshdup_avx(auVar38);
    auVar33 = vandps_avx(auVar33,auVar50);
  }
  auVar34 = vminss_avx(auVar34,auVar33);
  auVar33 = SUB6416(ZEXT464(0x3f800000),0);
  if ((uVar15 & 1) == 0) {
    auVar33 = vandps_avx(auVar38,auVar50);
  }
  auVar33 = vminss_avx(auVar34,auVar33);
  fVar31 = (ctx->config).tune_2plane_early_out_limit_correlation;
  uVar15 = 0xb;
  if (quant_limit < 0xb) {
    uVar15 = quant_limit;
  }
  fVar45 = fVar45 * fVar29;
  ei2 = &tmpbuf->ei2;
  dec_weight_ideal_value = tmpbuf->dec_weights_ideal;
  pdVar1 = bsd->decimation_tables;
  local_3f0 = tmpbuf->qwt_bitcounts;
  local_3f8 = tmpbuf->qwt_errors;
  local_508 = afStack_444[1];
  fVar30 = afStack_444[1] * 1.85;
  local_3e0 = &bsd->decimation_modes[0].refprec_2planes;
  local_3e8 = &bsd->block_modes[0].field_0x5;
  local_3c8 = bsd->block_modes;
  for (uVar25 = 3; -1 < (int)uVar25; uVar25 = uVar25 - 1) {
    if ((auVar33._0_4_ <= fVar31) && ((uVar25 == 3 || (blk->grayscale == false)))) {
      auVar39._4_4_ = uVar25;
      auVar39._0_4_ = uVar25;
      auVar39._8_4_ = uVar25;
      auVar39._12_4_ = uVar25;
      auVar35 = vpcmpeqd_avx(auVar39,_DAT_002f8df0);
      auVar34 = vcmpps_avx(*(undefined1 (*) [16])(blk->data_max).m,
                           *(undefined1 (*) [16])(blk->data_min).m,0);
      auVar34 = auVar35 & auVar34;
      if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar34[0xf])
      {
        if ((ctx->config).tune_candidate_limit == 0) {
          __assert_fail("config.tune_candidate_limit > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                        ,0x2d6,
                        "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                       );
        }
        if ((ctx->config).tune_refinement_limit == 0) {
          __assert_fail("config.tune_refinement_limit > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                        ,0x2d7,
                        "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                       );
        }
        if (bsd->decimation_mode_count_selected == 0) {
          __assert_fail("bsd.decimation_mode_count_selected > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                        ,0x2d8,
                        "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                       );
        }
        auVar40 = ZEXT1664(auVar40._0_16_);
        auVar65 = ZEXT1664(auVar65._0_16_);
        compute_ideal_colors_and_weights_2planes(bsd,blk,uVar25,&tmpbuf->ei1,ei2);
        uVar17 = 0;
        puVar20 = local_3e0;
        pdVar23 = pdVar1;
        for (uVar27 = 0; uVar27 < bsd->decimation_mode_count_selected; uVar27 = uVar27 + 1) {
          if ((~(-2 << ((byte)uVar15 & 0x1f)) & (uint)*puVar20) != 0) {
            compute_ideal_weights_for_decimation
                      (&tmpbuf->ei1,pdVar23,dec_weight_ideal_value + uVar17);
            compute_ideal_weights_for_decimation
                      (ei2,pdVar23,dec_weight_ideal_value + (ulong)uVar17 + 0x20);
          }
          uVar17 = uVar17 + 0x40;
          pdVar23 = pdVar23 + 1;
          puVar20 = puVar20 + 3;
        }
        auVar34 = *(undefined1 (*) [16])(tmpbuf->ei1).ep.endpt0[0].m;
        auVar56._8_4_ = 0x3f800000;
        auVar56._0_8_ = 0x3f8000003f800000;
        auVar56._12_4_ = 0x3f800000;
        auVar36 = vsubps_avx(auVar56,auVar34);
        auVar34 = vsubps_avx(*(undefined1 (*) [16])(tmpbuf->ei1).ep.endpt1[0].m,auVar34);
        auVar37 = vdivps_avx(auVar36,auVar34);
        auVar61._8_4_ = 0x3f000000;
        auVar61._0_8_ = 0x3f0000003f000000;
        auVar61._12_4_ = 0x3f000000;
        auVar34 = vcmpps_avx(auVar61,auVar37,1);
        auVar63._8_4_ = 0x41200000;
        auVar63._0_8_ = 0x4120000041200000;
        auVar63._12_4_ = 0x41200000;
        auVar64 = ZEXT1664(auVar63);
        auVar36 = vcmpps_avx(auVar37,auVar63,1);
        auVar34 = vandps_avx(auVar34,auVar36);
        auVar36 = vblendvps_avx(auVar63,auVar37,auVar34);
        auVar34 = *(undefined1 (*) [16])(tmpbuf->ei2).ep.endpt0[0].m;
        auVar37 = vsubps_avx(auVar56,auVar34);
        auVar34 = vsubps_avx(*(undefined1 (*) [16])(tmpbuf->ei2).ep.endpt1[0].m,auVar34);
        auVar66 = vdivps_avx(auVar37,auVar34);
        auVar34 = vcmpps_avx(auVar61,auVar66,1);
        auVar37 = vcmpps_avx(auVar66,auVar63,1);
        auVar34 = vandps_avx(auVar34,auVar37);
        auVar34 = vblendvps_avx(auVar63,auVar66,auVar34);
        auVar57._8_4_ = 0x7149f2ca;
        auVar57._0_8_ = 0x7149f2ca7149f2ca;
        auVar57._12_4_ = 0x7149f2ca;
        auVar36 = vblendvps_avx(auVar36,auVar57,auVar35);
        auVar37 = vshufps_avx(auVar36,auVar36,0xe);
        auVar36 = vminps_avx(auVar36,auVar37);
        auVar37 = vmovshdup_avx(auVar36);
        auVar36 = vminss_avx(auVar36,auVar37);
        auVar34 = vblendvps_avx(auVar57,auVar34,auVar35);
        auVar37 = vshufps_avx(auVar34,auVar34,0xe);
        auVar34 = vminps_avx(auVar34,auVar37);
        auVar37 = vmovshdup_avx(auVar34);
        auVar34 = vminss_avx(auVar34,auVar37);
        compute_angular_endpoints_2planes(bsd,dec_weight_ideal_value,uVar15,tmpbuf);
        uVar28 = (ulong)bsd->block_mode_count_1plane_selected;
        uVar27 = CONCAT44(0,bsd->block_mode_count_1plane_2plane_selected);
        uVar22 = uVar28 << 6;
        pbVar26 = local_3e8 + uVar28 * 6;
        local_550._0_8_ = uVar27;
        for (; uVar28 < uVar27; uVar28 = uVar28 + 1) {
          if ((*pbVar26 & 1) == 0) {
            __assert_fail("bm.is_dual_plane",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                          ,0x32a,
                          "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                         );
          }
          if (uVar15 < pbVar26[-2]) {
            tmpbuf->qwt_errors[uVar28] = 1e+38;
          }
          else {
            tmpbuf->qwt_bitcounts[uVar28] = 'm' - pbVar26[-1];
            fVar32 = tmpbuf->weight_high_value1[uVar28];
            if (auVar36._0_4_ * 1.02 < fVar32) {
              tmpbuf->weight_high_value1[uVar28] = 1.0;
              fVar32 = 1.0;
            }
            if (auVar34._0_4_ * 1.02 < tmpbuf->weight_high_value2[uVar28]) {
              tmpbuf->weight_high_value2[uVar28] = 1.0;
            }
            bVar4 = pbVar26[-3];
            pdVar23 = pdVar1 + bVar4;
            compute_quantized_weights_for_decimation
                      (pdVar23,tmpbuf->weight_low_value1[uVar28],fVar32,
                       dec_weight_ideal_value + (ulong)bVar4 * 0x40,(float *)&local_220,
                       tmpbuf->dec_weights_uquant + (uVar22 & 0xffffffff),(uint)pbVar26[-2]);
            compute_quantized_weights_for_decimation
                      (pdVar23,tmpbuf->weight_low_value2[uVar28],tmpbuf->weight_high_value2[uVar28],
                       tmpbuf->dec_weights_ideal + (ulong)bVar4 * 0x40 + 0x20,local_220.endpt1[3].m,
                       tmpbuf->dec_weights_uquant + (uVar22 & 0xffffffff) + 0x20,(uint)pbVar26[-2]);
            fVar32 = compute_error_of_weight_set_2planes
                               (&tmpbuf->ei1,ei2,pdVar23,(float *)&local_220,local_220.endpt1[3].m);
            tmpbuf->qwt_errors[uVar28] = fVar32;
          }
          uVar22 = uVar22 + 0x40;
          pbVar26 = pbVar26 + 6;
        }
        if ((tmpbuf->ei1).ep.partition_count != 1) {
          __assert_fail("partition_count == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                        ,0x2c,
                        "void merge_endpoints(const endpoints &, const endpoints &, unsigned int, endpoints &)"
                       );
        }
        local_220.partition_count = 1;
        local_220.endpt0[0].m =
             (__m128)vblendvps_avx(*(undefined1 (*) [16])(tmpbuf->ei1).ep.endpt0[0].m,
                                   *(undefined1 (*) [16])(tmpbuf->ei2).ep.endpt0[0].m,auVar35);
        local_220.endpt1[0].m =
             (__m128)vblendvps_avx(*(undefined1 (*) [16])(tmpbuf->ei1).ep.endpt1[0].m,
                                   *(undefined1 (*) [16])(tmpbuf->ei2).ep.endpt1[0].m,auVar35);
        pi = block_size_descriptor::get_partition_info(bsd,1,0);
        uVar16 = compute_ideal_endpoint_formats
                           (pi,blk,&local_220,local_3f0,local_3f8,(ctx->config).tune_candidate_limit
                            ,bsd->block_mode_count_1plane_selected,
                            bsd->block_mode_count_1plane_2plane_selected,(uint8_t (*) [4])local_240,
                            local_260,local_280,local_110,tmpbuf);
        auVar62 = ZEXT464((uint)local_320._16_4_);
        auVar58 = ZEXT464(0x7149f2ca);
        for (uVar17 = 0; fVar32 = auVar58._0_4_, uVar17 < uVar16; uVar17 = uVar17 + 1) {
          uVar27 = (ulong)uVar17;
          iVar6 = local_260[uVar27];
          if ((iVar6 < (int)bsd->block_mode_count_1plane_selected) ||
             ((int)bsd->block_mode_count_1plane_2plane_selected <= iVar6)) {
            __assert_fail("bm_packed_index >= static_cast<int>(bsd.block_mode_count_1plane_selected) && bm_packed_index < static_cast<int>(bsd.block_mode_count_1plane_2plane_selected)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                          ,0x37b,
                          "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                         );
          }
          local_550._0_4_ = fVar32;
          bVar4 = local_3c8[iVar6].decimation_mode;
          uVar22 = (ulong)bsd->decimation_tables[bVar4].weight_count;
          if (uVar22 == 0) {
            __assert_fail("di.weight_count > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                          ,0x380,
                          "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                         );
          }
          local_420 = local_3c8 + iVar6;
          auVar64 = ZEXT1664(auVar64._0_16_);
          auVar40 = ZEXT1664(auVar40._0_16_);
          auVar65 = ZEXT1664(auVar65._0_16_);
          memcpy(&local_f0,&local_220,0x90);
          auVar62 = ZEXT464(auVar62._0_4_);
          for (uVar28 = 0; uVar22 != uVar28; uVar28 = uVar28 + 1) {
            local_3a0[uVar28 + 0x40] = tmpbuf->dec_weights_uquant[uVar28 + (uint)(iVar6 << 6)];
            local_3a0[uVar28 + 0x60] =
                 tmpbuf->dec_weights_uquant[uVar28 + (uint)(iVar6 << 6) + 0x20];
          }
          uVar18 = (ctx->config).tune_refinement_limit;
          local_530 = -NAN;
          auVar58 = ZEXT464((uint)fVar32);
          for (uVar21 = 0; uVar21 < uVar18; uVar21 = uVar21 + 1) {
            fVar32 = auVar62._0_4_;
            local_550._0_4_ = auVar58._0_4_;
            auVar34 = auVar62._0_16_;
            auVar64 = ZEXT1664(auVar64._0_16_);
            auVar40 = ZEXT1664(auVar40._0_16_);
            auVar65 = ZEXT1664(auVar65._0_16_);
            recompute_ideal_colors_2planes
                      (blk,bsd,pdVar1 + bVar4,local_3a0 + 0x40,local_3a0 + 0x60,&local_f0,&local_290
                       ,&local_2a0,uVar25);
            color0.m._8_8_ = local_f0.endpt1[0].m._0_8_;
            color0.m[0] = local_f0.endpt0[0].m[0];
            color0.m[1] = local_f0.endpt0[0].m[1];
            color1.m._0_8_ = local_290.m._0_8_;
            color1.m[2] = local_2a0.m[0];
            color1.m[3] = local_2a0.m[1];
            rgbs_color_00.m._0_8_ = auVar34._0_8_;
            rgbs_color_00.m._8_8_ = auVar64._0_8_;
            rgbo_color_00.m._0_8_ = auVar40._0_8_;
            rgbo_color_00.m._8_8_ = auVar65._0_8_;
            uVar14 = pack_color_endpoints
                               (color0,color1,rgbs_color_00,rgbo_color_00,
                                (uint)*(byte *)((long)(local_220.endpt0 + -3) + uVar27 * 4),
                                local_3a0 + 0x14,local_280[uVar27]);
            auVar35 = auVar65._0_16_;
            auVar34 = auVar40._0_16_;
            local_3a0[8] = uVar14;
            local_3a0[1] = '\x01';
            local_3a0[2] = '\0';
            local_3a0._6_2_ = 0;
            local_3a0._12_4_ = local_280[uVar27];
            local_3a0._4_2_ = local_420->mode_index;
            local_3a0[3] = (int8_t)uVar25;
            local_3a0[0] = '\x03';
            if (local_530 == -NAN) {
              auVar42._0_4_ =
                   compute_symbolic_block_difference_2plane
                             (&ctx->config,bsd,(symbolic_compressed_block *)local_3a0,blk);
              auVar35 = auVar65._0_16_;
              auVar34 = auVar40._0_16_;
              auVar42._4_60_ = extraout_var_05;
              if ((auVar42._0_4_ != -1e+30) || (NAN(auVar42._0_4_))) {
                auVar64 = ZEXT1664(auVar42._0_16_);
              }
              else {
                local_3a0[0] = '\0';
                auVar64 = ZEXT464(0x7149f2ca);
              }
              auVar62 = ZEXT464((uint)fVar32);
              auVar37 = auVar64._0_16_;
              auVar36 = vminss_avx(auVar37,ZEXT416(auVar58._0_4_));
              auVar58 = ZEXT1664(auVar36);
              fVar59 = auVar64._0_4_;
              if (fVar32 * ((float)(ctx->config).tune_refinement_limit * 0.045 + 1.08) < fVar59)
              break;
              local_550._0_4_ = auVar36._0_4_;
              if (fVar32 <= fVar59) {
                auVar37 = ZEXT416((uint)fVar32);
              }
              else {
                local_3a0._16_4_ = fVar59;
                local_320._32_4_ = (undefined4)local_3a0._32_8_;
                local_320._36_4_ = SUB84(local_3a0._32_8_,4);
                local_320._40_8_ = local_3a0._40_8_;
                local_320._48_8_ = local_3a0._48_8_;
                local_320._56_8_ = local_3a0._56_8_;
                local_320._96_32_ = local_3a0._96_32_;
                local_320[0] = local_3a0[0];
                local_320[1] = (uint8_t)local_3a0._1_2_;
                local_320._2_2_ =
                     (undefined2)
                     (CONCAT13(local_3a0[3],CONCAT21(local_3a0._1_2_,local_3a0[0])) >> 0x10);
                local_320._4_2_ = local_3a0._4_2_;
                local_320._6_2_ = local_3a0._6_2_;
                local_320[8] = local_3a0[8];
                local_320[9] = local_3a0[9];
                local_320[10] = local_3a0[10];
                local_320[0xb] = local_3a0[0xb];
                local_320._12_4_ = local_3a0._12_4_;
                local_320._16_4_ = fVar59;
                local_320._20_4_ = local_3a0._20_4_;
                local_320._24_4_ = (undefined4)local_3a0._24_8_;
                local_320._28_4_ = SUB84(local_3a0._24_8_,4);
                if (fVar59 < fVar45) {
                  auVar62 = ZEXT1664(auVar37);
                  auVar58 = ZEXT464(auVar36._0_4_);
                  uVar17 = uVar16;
                  break;
                }
              }
            }
            else {
              auVar37 = ZEXT416((uint)fVar32);
            }
            fVar32 = auVar37._0_4_;
            aVar5 = (ctx->config).profile;
            if (pdVar1[bVar4].weight_count == bsd->texel_count) {
              auVar64 = ZEXT1664(auVar37);
              auVar40 = ZEXT1664(auVar34);
              auVar65 = ZEXT1664(auVar35);
              bVar12 = realign_weights_undecimated
                                 (aVar5,bsd,blk,(symbolic_compressed_block *)local_3a0);
            }
            else {
              auVar64 = ZEXT1664(auVar37);
              auVar40 = ZEXT1664(auVar34);
              auVar65 = ZEXT1664(auVar35);
              bVar12 = realign_weights_decimated
                                 (aVar5,bsd,blk,(symbolic_compressed_block *)local_3a0);
            }
            auVar43._0_4_ =
                 compute_symbolic_block_difference_2plane
                           (&ctx->config,bsd,(symbolic_compressed_block *)local_3a0,blk);
            auVar43._4_60_ = extraout_var_06;
            if ((auVar43._0_4_ != -1e+30) || (NAN(auVar43._0_4_))) {
              auVar62 = ZEXT1664(auVar43._0_16_);
            }
            else {
              local_3a0[0] = '\0';
              auVar62 = ZEXT464(0x7149f2ca);
            }
            auVar35 = auVar62._0_16_;
            auVar34 = vminss_avx(auVar35,ZEXT416((uint)local_550._0_4_));
            auVar58 = ZEXT1664(auVar34);
            uVar18 = (ctx->config).tune_refinement_limit;
            fVar59 = auVar62._0_4_;
            if (fVar32 * ((float)((int)local_530 + uVar18) * 0.045 + 1.0) < fVar59) {
LAB_00254f52:
              auVar62 = ZEXT464((uint)fVar32);
              break;
            }
            if (fVar32 <= fVar59) {
              auVar35 = ZEXT416((uint)fVar32);
              if (bVar12 == false) goto LAB_00254f52;
            }
            else {
              local_3a0._16_4_ = fVar59;
              local_320._32_4_ = (undefined4)local_3a0._32_8_;
              local_320._36_4_ = SUB84(local_3a0._32_8_,4);
              local_320._40_8_ = local_3a0._40_8_;
              local_320._48_8_ = local_3a0._48_8_;
              local_320._56_8_ = local_3a0._56_8_;
              local_320._96_32_ = local_3a0._96_32_;
              local_320[0] = local_3a0[0];
              local_320[1] = (uint8_t)local_3a0._1_2_;
              local_320._2_2_ =
                   (undefined2)
                   (CONCAT13(local_3a0[3],CONCAT21(local_3a0._1_2_,local_3a0[0])) >> 0x10);
              local_320._4_2_ = local_3a0._4_2_;
              local_320._6_2_ = local_3a0._6_2_;
              local_320._8_8_ =
                   (undefined8)
                   (CONCAT46(local_3a0._12_4_,CONCAT42(local_3a0._8_4_,local_3a0._6_2_)) >> 0x10);
              local_320._16_4_ = fVar59;
              local_320._20_4_ = local_3a0._20_4_;
              local_320._24_4_ = (undefined4)local_3a0._24_8_;
              local_320._28_4_ = SUB84(local_3a0._24_8_,4);
              if ((bVar12 & fVar45 <= fVar59) == 0) {
                if (fVar59 < fVar45) {
                  uVar17 = uVar16;
                }
                break;
              }
            }
            local_530 = (float)((int)local_530 + -1);
            auVar62 = ZEXT1664(auVar35);
          }
        }
        if (fVar30 < fVar32) break;
        if (fVar32 < fVar29) goto LAB_002550ea;
      }
    }
  }
  lVar24 = 2;
  while (lVar24 <= local_3d0) {
    uVar15 = local_3b8[lVar24];
    uVar25 = *(uint *)((long)&local_3c8 + lVar24 * 4);
    if (uVar15 <= uVar25) {
      uVar25 = uVar15;
    }
    uVar15 = find_best_partition_candidates
                       (bsd,blk,(uint)lVar24,uVar15,&local_220.partition_count,uVar25);
    uVar27 = 0;
    while (uVar15 != uVar27) {
      auVar44._0_4_ =
           compress_symbolic_block_for_partition_1plane
                     (&ctx->config,bsd,blk,false,fVar45,(uint)lVar24,
                      (&((endpoints *)(local_220.endpt0 + -1))->partition_count)[uVar27],
                      (symbolic_compressed_block *)local_320,tmpbuf,quant_limit);
      auVar44._4_60_ = extraout_var_07;
      auVar33 = vminss_avx(ZEXT416((uint)afStack_444[lVar24]),auVar44._0_16_);
      afStack_444[lVar24] = auVar33._0_4_;
      if ((afStack_414[lVar24] * 1.85 * local_508 < auVar33._0_4_) ||
         (uVar27 = uVar27 + 1, auVar44._0_4_ < fVar29)) goto LAB_002550ea;
    }
    fVar31 = local_508 * afStack_414[lVar24];
    local_508 = afStack_444[lVar24];
    lVar24 = lVar24 + 1;
    if (fVar31 < local_508) break;
  }
LAB_002550ea:
  pcb = local_3d8;
  if (local_320[0] == '\0') {
    local_320[0] = '\x02';
    auVar33 = vmaxps_avx(*(undefined1 (*) [16])(blk->origin_texel).m,ZEXT816(0) << 0x40);
    auVar51._8_4_ = 0x3f800000;
    auVar51._0_8_ = 0x3f8000003f800000;
    auVar51._12_4_ = 0x3f800000;
    auVar33 = vminps_avx(auVar33,auVar51);
    local_320._20_4_ = (undefined4)(auVar33._0_4_ * 65535.0 + 0.5);
    local_320._24_4_ = (undefined4)(auVar33._4_4_ * 65535.0 + 0.5);
    local_320._28_4_ = (undefined4)(auVar33._8_4_ * 65535.0 + 0.5);
    local_320._32_4_ = (undefined4)(auVar33._12_4_ * 65535.0 + 0.5);
  }
  goto LAB_00255153;
}

Assistant:

void compress_block(
	const astcenc_contexti& ctx,
	const image_block& blk,
	uint8_t pcb[16],
	compression_working_buffers& tmpbuf)
{
	astcenc_profile decode_mode = ctx.config.profile;
	symbolic_compressed_block scb;
	const block_size_descriptor& bsd = *ctx.bsd;
	float lowest_correl;

	TRACE_NODE(node0, "block");
	trace_add_data("pos_x", blk.xpos);
	trace_add_data("pos_y", blk.ypos);
	trace_add_data("pos_z", blk.zpos);

	// Set stricter block targets for luminance data as we have more bits to play with
	bool block_is_l = blk.is_luminance();
	float block_is_l_scale = block_is_l ? 1.0f / 1.5f : 1.0f;

	// Set slightly stricter block targets for lumalpha data as we have more bits to play with
	bool block_is_la = blk.is_luminancealpha();
	float block_is_la_scale = block_is_la ? 1.0f / 1.05f : 1.0f;

	bool block_skip_two_plane = false;
	int max_partitions = ctx.config.tune_partition_count_limit;

	unsigned int requested_partition_indices[3] {
		ctx.config.tune_2partition_index_limit,
		ctx.config.tune_3partition_index_limit,
		ctx.config.tune_4partition_index_limit
	};

	unsigned int requested_partition_trials[3] {
		ctx.config.tune_2partitioning_candidate_limit,
		ctx.config.tune_3partitioning_candidate_limit,
		ctx.config.tune_4partitioning_candidate_limit
	};

#if defined(ASTCENC_DIAGNOSTICS)
	// Do this early in diagnostic builds so we can dump uniform metrics
	// for every block. Do it later in release builds to avoid redundant work!
	float error_weight_sum = hadd_s(blk.channel_weight) * bsd.texel_count;
	float error_threshold = ctx.config.tune_db_limit
	                      * error_weight_sum
	                      * block_is_l_scale
	                      * block_is_la_scale;

	lowest_correl = prepare_block_statistics(bsd.texel_count, blk);
	trace_add_data("lowest_correl", lowest_correl);
	trace_add_data("tune_error_threshold", error_threshold);
#endif

	// Detected a constant-color block
	if (all(blk.data_min == blk.data_max))
	{
		TRACE_NODE(node1, "pass");
		trace_add_data("partition_count", 0);
		trace_add_data("plane_count", 1);

		scb.partition_count = 0;

		// Encode as FP16 if using HDR
		if ((decode_mode == ASTCENC_PRF_HDR) ||
		    (decode_mode == ASTCENC_PRF_HDR_RGB_LDR_A))
		{
			scb.block_type = SYM_BTYPE_CONST_F16;
			vint4 color_f16 = float_to_float16(blk.origin_texel);
			store(color_f16, scb.constant_color);
		}
		// Encode as UNORM16 if NOT using HDR
		else
		{
			scb.block_type = SYM_BTYPE_CONST_U16;
			vfloat4 color_f32 = clamp(0.0f, 1.0f, blk.origin_texel) * 65535.0f;
			vint4 color_u16 = float_to_int_rtn(color_f32);
			store(color_u16, scb.constant_color);
		}

		trace_add_data("exit", "quality hit");

		symbolic_to_physical(bsd, scb, pcb);
		return;
	}

#if !defined(ASTCENC_DIAGNOSTICS)
	float error_weight_sum = hadd_s(blk.channel_weight) * bsd.texel_count;
	float error_threshold = ctx.config.tune_db_limit
	                      * error_weight_sum
	                      * block_is_l_scale
	                      * block_is_la_scale;
#endif

	// Set SCB and mode errors to a very high error value
	scb.errorval = ERROR_CALC_DEFAULT;
	scb.block_type = SYM_BTYPE_ERROR;

	float best_errorvals_for_pcount[BLOCK_MAX_PARTITIONS] {
		ERROR_CALC_DEFAULT, ERROR_CALC_DEFAULT, ERROR_CALC_DEFAULT, ERROR_CALC_DEFAULT
	};

	float exit_thresholds_for_pcount[BLOCK_MAX_PARTITIONS] {
		0.0f,
		ctx.config.tune_2partition_early_out_limit_factor,
		ctx.config.tune_3partition_early_out_limit_factor,
		0.0f
	};

	// Trial using 1 plane of weights and 1 partition.

	// Most of the time we test it twice, first with a mode cutoff of 0 and then with the specified
	// mode cutoff. This causes an early-out that speeds up encoding of easy blocks. However, this
	// optimization is disabled for 4x4 and 5x4 blocks where it nearly always slows down the
	// compression and slightly reduces image quality.

	float errorval_mult[2] {
		1.0f / ctx.config.tune_mse_overshoot,
		1.0f
	};

	const float errorval_overshoot = 1.0f / ctx.config.tune_mse_overshoot;

	// Only enable MODE0 fast path if enabled
	// Never enable for 3D blocks as no "always" block modes are available
	int start_trial = 1;
 	if ((ctx.config.tune_search_mode0_enable >= TUNE_MIN_SEARCH_MODE0) && (bsd.zdim == 1))
	{
		start_trial = 0;
	}

	int quant_limit = QUANT_32;
	for (int i = start_trial; i < 2; i++)
	{
		TRACE_NODE(node1, "pass");
		trace_add_data("partition_count", 1);
		trace_add_data("plane_count", 1);
		trace_add_data("search_mode", i);

		float errorval = compress_symbolic_block_for_partition_1plane(
		    ctx.config, bsd, blk, i == 0,
		    error_threshold * errorval_mult[i] * errorval_overshoot,
		    1, 0,  scb, tmpbuf, QUANT_32);

		// Record the quant level so we can use the filter later searches
		const auto& bm = bsd.get_block_mode(scb.block_mode);
		quant_limit = bm.get_weight_quant_mode();

		best_errorvals_for_pcount[0] = astc::min(best_errorvals_for_pcount[0], errorval);
		if (errorval < (error_threshold * errorval_mult[i]))
		{
			trace_add_data("exit", "quality hit");
			goto END_OF_TESTS;
		}
	}

#if !defined(ASTCENC_DIAGNOSTICS)
	lowest_correl = prepare_block_statistics(bsd.texel_count, blk);
#endif

	block_skip_two_plane = lowest_correl > ctx.config.tune_2plane_early_out_limit_correlation;

	// Test the four possible 1-partition, 2-planes modes. Do this in reverse, as
	// alpha is the most likely to be non-correlated if it is present in the data.
	for (int i = BLOCK_MAX_COMPONENTS - 1; i >= 0; i--)
	{
		TRACE_NODE(node1, "pass");
		trace_add_data("partition_count", 1);
		trace_add_data("plane_count", 2);
		trace_add_data("plane_component", i);

		if (block_skip_two_plane)
		{
			trace_add_data("skip", "tune_2plane_early_out_limit_correlation");
			continue;
		}

		if (blk.grayscale && i != 3)
		{
			trace_add_data("skip", "grayscale block");
			continue;
		}

		if (blk.is_constant_channel(i))
		{
			trace_add_data("skip", "constant component");
			continue;
		}

		float errorval = compress_symbolic_block_for_partition_2planes(
		    ctx.config, bsd, blk, error_threshold * errorval_overshoot,
		    i, scb, tmpbuf, quant_limit);

		// If attempting two planes is much worse than the best one plane result
		// then further two plane searches are unlikely to help so move on ...
		if (errorval > (best_errorvals_for_pcount[0] * 1.85f))
		{
			break;
		}

		if (errorval < error_threshold)
		{
			trace_add_data("exit", "quality hit");
			goto END_OF_TESTS;
		}
	}

	// Find best blocks for 2, 3 and 4 partitions
	for (int partition_count = 2; partition_count <= max_partitions; partition_count++)
	{
		unsigned int partition_indices[TUNE_MAX_PARTITIONING_CANDIDATES];

		unsigned int requested_indices = requested_partition_indices[partition_count - 2];

		unsigned int requested_trials = requested_partition_trials[partition_count - 2];
		requested_trials = astc::min(requested_trials, requested_indices);

		unsigned int actual_trials = find_best_partition_candidates(
		    bsd, blk, partition_count, requested_indices, partition_indices, requested_trials);

		float best_error_in_prev = best_errorvals_for_pcount[partition_count - 2];

		for (unsigned int i = 0; i < actual_trials; i++)
		{
			TRACE_NODE(node1, "pass");
			trace_add_data("partition_count", partition_count);
			trace_add_data("partition_index", partition_indices[i]);
			trace_add_data("plane_count", 1);
			trace_add_data("search_mode", i);

			float errorval = compress_symbolic_block_for_partition_1plane(
			    ctx.config, bsd, blk, false,
			    error_threshold * errorval_overshoot,
			    partition_count, partition_indices[i],
			    scb, tmpbuf, quant_limit);

			best_errorvals_for_pcount[partition_count - 1] = astc::min(best_errorvals_for_pcount[partition_count - 1], errorval);

			// If using N partitions doesn't improve much over using N-1 partitions then skip trying
			// N+1. Error can dramatically improve if the data is correlated or non-correlated and
			// aligns with a partitioning that suits that encoding, so for this inner loop check add
			// a large error scale because the "other" trial could be a lot better.
			float best_error = best_errorvals_for_pcount[partition_count - 1];
			float best_error_scale = exit_thresholds_for_pcount[partition_count - 1] * 1.85f;
			if (best_error > (best_error_in_prev * best_error_scale))
			{
				trace_add_data("skip", "tune_partition_early_out_limit_factor");
				goto END_OF_TESTS;
			}

			if (errorval < error_threshold)
			{
				trace_add_data("exit", "quality hit");
				goto END_OF_TESTS;
			}
		}

		// If using N partitions doesn't improve much over using N-1 partitions then skip trying N+1
		float best_error = best_errorvals_for_pcount[partition_count - 1];
		float best_error_scale = exit_thresholds_for_pcount[partition_count - 1];
		if (best_error > (best_error_in_prev * best_error_scale))
		{
			trace_add_data("skip", "tune_partition_early_out_limit_factor");
			goto END_OF_TESTS;
		}
	}

	trace_add_data("exit", "quality not hit");

END_OF_TESTS:
	// If we still have an error block then convert to something we can encode
	// TODO: Do something more sensible here, such as average color block
	if (scb.block_type == SYM_BTYPE_ERROR)
	{
#if defined(ASTCENC_DIAGNOSTICS)
		static bool printed_once = false;
		if (!printed_once)
		{
			printed_once = true;
			printf("WARN: At least one block failed to find a valid encoding.\n"
			       "      Try increasing compression quality settings.\n\n");
		}
#endif

		scb.block_type = SYM_BTYPE_CONST_U16;
		vfloat4 color_f32 = clamp(0.0f, 1.0f, blk.origin_texel) * 65535.0f;
		vint4 color_u16 = float_to_int_rtn(color_f32);
		store(color_u16, scb.constant_color);
	}

	// Compress to a physical block
	symbolic_to_physical(bsd, scb, pcb);
}